

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,CaseDefinition caseDef,int numPatchesToDraw)

{
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)17>_> data_02;
  RefData<vk::Handle<(vk::HandleType)23>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  deUint32 dVar1;
  int iVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  Allocator *pAVar5;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)19> *pHVar7;
  Handle<(vk::HandleType)17> *pHVar8;
  Handle<(vk::HandleType)24> *pHVar9;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkBuffer *pVVar10;
  Handle<(vk::HandleType)22> *pHVar11;
  DescriptorSetUpdateBuilder *this_02;
  Location local_3c8;
  VkDescriptorSet local_3c0;
  DescriptorSetUpdateBuilder local_3b8;
  deUint64 local_370;
  undefined1 local_368 [8];
  VkDescriptorBufferInfo resultBufferInfo;
  Move<vk::VkCommandBuffer_s_*> local_348;
  RefData<vk::VkCommandBuffer_s_*> local_328;
  Move<vk::Handle<(vk::HandleType)24>_> local_308;
  RefData<vk::Handle<(vk::HandleType)24>_> local_2e8;
  deUint64 local_2c8;
  Move<vk::Handle<(vk::HandleType)16>_> local_2c0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_2a0;
  deUint64 local_280;
  Move<vk::Handle<(vk::HandleType)23>_> local_278;
  RefData<vk::Handle<(vk::HandleType)23>_> local_258;
  Move<vk::Handle<(vk::HandleType)17>_> local_238;
  RefData<vk::Handle<(vk::HandleType)17>_> local_218;
  deUint64 local_1f8;
  VkDescriptorPool local_1f0;
  Move<vk::Handle<(vk::HandleType)22>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_1c8;
  DescriptorPoolBuilder local_1a8;
  Move<vk::Handle<(vk::HandleType)21>_> local_190;
  RefData<vk::Handle<(vk::HandleType)21>_> local_170;
  DescriptorSetLayoutBuilder local_150;
  Move<vk::Handle<(vk::HandleType)19>_> local_108;
  RefData<vk::Handle<(vk::HandleType)19>_> local_e8;
  deUint32 local_c4;
  VkBufferCreateInfo local_c0;
  deUint32 local_84;
  VkBufferCreateInfo local_80;
  TextureFormat local_34;
  int local_2c;
  Context *pCStack_28;
  int numPatchesToDraw_local;
  Context *context_local;
  BaseTestInstance *this_local;
  CaseDefinition caseDef_local;
  
  caseDef_local._0_8_ = caseDef._8_8_;
  this_local = caseDef._0_8_;
  local_2c = numPatchesToDraw;
  pCStack_28 = context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_016b17c8;
  *(BaseTestInstance **)&this->m_caseDef = this_local;
  *(undefined8 *)&(this->m_caseDef).winding = caseDef_local._0_8_;
  this->m_numPatchesToDraw = local_2c;
  this->m_vertexFormat = VK_FORMAT_R32_SFLOAT;
  local_34 = ::vk::mapVkFormat(this->m_vertexFormat);
  dVar1 = tcu::getPixelSize(local_34);
  this->m_vertexStride = dVar1;
  outerEdgeDescriptions(&this->m_edgeDescriptions,(this->m_caseDef).primitiveType);
  iVar2 = tessellation::(anonymous_namespace)::InvariantOuterEdge::computeMaxPrimitiveCount<12ul>
                    (this->m_numPatchesToDraw,(TessPrimitiveType)this_local,this_local._4_4_,
                     (bool)((undefined1)caseDef_local.spacingMode & SPACINGMODE_FRACTIONAL_ODD),
                     (float (*) [12])
                     tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance::
                     m_singleOuterEdgeLevels);
  this->m_maxNumPrimitivesInDrawCall = iVar2;
  this->m_vertexDataSizeBytes = (ulong)(this->m_numPatchesToDraw * this->m_vertexStride * 6);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pAVar5 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo(&local_80,this->m_vertexDataSizeBytes,0x80);
  local_84 = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            (&this->m_vertexBuffer,pDVar3,pVVar4,pAVar5,&local_80,
             ::vk::MemoryRequirement::HostVisible);
  this->m_resultBufferPrimitiveDataOffset = 0x10;
  this->m_resultBufferSizeBytes =
       (long)this->m_resultBufferPrimitiveDataOffset +
       (long)this->m_maxNumPrimitivesInDrawCall * 0x40;
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pAVar5 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo(&local_c0,this->m_resultBufferSizeBytes,0x20);
  local_c4 = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            (&this->m_resultBuffer,pDVar3,pVVar4,pAVar5,&local_c0,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_150);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_150,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,8);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetLayoutBuilder::build(&local_108,this_00,pDVar3,pVVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data.object.m_internal = local_e8.object.m_internal;
  data.deleter.m_device = local_e8.deleter.m_device;
  data.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            (&this->m_descriptorSetLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_108);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_150);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_1a8);
  this_01 = ::vk::DescriptorPoolBuilder::addType(&local_1a8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::build(&local_190,this_01,pDVar3,pVVar4,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_170,(Move *)&local_190);
  data_00.deleter.m_deviceIface = local_170.deleter.m_deviceIface;
  data_00.object.m_internal = local_170.object.m_internal;
  data_00.deleter.m_device = local_170.deleter.m_device;
  data_00.deleter.m_allocator = local_170.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique(&this->m_descriptorPool,data_00)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_190);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_1a8);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  local_1f0.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  local_1f8 = pHVar7->m_internal;
  makeDescriptorSet(&local_1e8,pDVar3,pVVar4,local_1f0,(VkDescriptorSetLayout)local_1f8);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  data_01.deleter.m_deviceIface = local_1c8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1c8.object.m_internal;
  data_01.deleter.m_device = local_1c8.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_1c8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique(&this->m_descriptorSet,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_1e8);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  makeRenderPassWithoutAttachments(&local_238,pDVar3,pVVar4);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_218,(Move *)&local_238);
  data_02.deleter.m_deviceIface = local_218.deleter.m_deviceIface;
  data_02.object.m_internal = local_218.object.m_internal;
  data_02.deleter.m_device = local_218.deleter.m_device;
  data_02.deleter.m_allocator = local_218.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique(&this->m_renderPass,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_238);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_280 = pHVar8->m_internal;
  makeFramebufferWithoutAttachments(&local_278,pDVar3,pVVar4,(VkRenderPass)local_280);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_258,(Move *)&local_278);
  data_03.deleter.m_deviceIface = local_258.deleter.m_deviceIface;
  data_03.object.m_internal = local_258.object.m_internal;
  data_03.deleter.m_device = local_258.deleter.m_device;
  data_03.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique(&this->m_framebuffer,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_278);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  local_2c8 = pHVar7->m_internal;
  makePipelineLayout(&local_2c0,pDVar3,pVVar4,(VkDescriptorSetLayout)local_2c8);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a0,(Move *)&local_2c0);
  data_04.deleter.m_deviceIface = local_2a0.deleter.m_deviceIface;
  data_04.object.m_internal = local_2a0.object.m_internal;
  data_04.deleter.m_device = local_2a0.deleter.m_device;
  data_04.deleter.m_allocator = local_2a0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique(&this->m_pipelineLayout,data_04)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_2c0);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  dVar1 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  makeCommandPool(&local_308,pDVar3,pVVar4,dVar1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2e8,(Move *)&local_308);
  data_05.deleter.m_deviceIface = local_2e8.deleter.m_deviceIface;
  data_05.object.m_internal = local_2e8.object.m_internal;
  data_05.deleter.m_device = local_2e8.deleter.m_device;
  data_05.deleter.m_allocator = local_2e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique(&this->m_cmdPool,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_308);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  resultBufferInfo.range = pHVar9->m_internal;
  ::vk::allocateCommandBuffer
            (&local_348,pDVar3,pVVar4,(VkCommandPool)resultBufferInfo.range,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_328,(Move *)&local_348);
  data_06.deleter.m_deviceIface = local_328.deleter.m_deviceIface;
  data_06.object = local_328.object;
  data_06.deleter.m_device = local_328.deleter.m_device;
  data_06.deleter.m_pool.m_internal = local_328.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique(&this->m_cmdBuffer,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_348);
  vki = Context::getInstanceInterface(pCStack_28);
  physDevice = Context::getPhysicalDevice(pCStack_28);
  requireFeatures(vki,physDevice,0xb);
  pVVar10 = tessellation::Buffer::get(&this->m_resultBuffer);
  local_370 = pVVar10->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_368,(VkBuffer)local_370,0,this->m_resultBufferSizeBytes
            );
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_3b8);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_3c0.m_internal = pHVar11->m_internal;
  local_3c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_3b8,local_3c0,&local_3c8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_368);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,pDVar3,pVVar4);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_3b8);
  return;
}

Assistant:

BaseTestInstance::BaseTestInstance (Context& context, const CaseDefinition caseDef, const int numPatchesToDraw)
	: TestInstance							(context)
	, m_caseDef								(caseDef)
	, m_numPatchesToDraw					(numPatchesToDraw)
	, m_vertexFormat						(VK_FORMAT_R32_SFLOAT)
	, m_vertexStride						(tcu::getPixelSize(mapVkFormat(m_vertexFormat)))
	, m_edgeDescriptions					(outerEdgeDescriptions(m_caseDef.primitiveType))
	, m_maxNumPrimitivesInDrawCall			(computeMaxPrimitiveCount(m_numPatchesToDraw, caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode, m_singleOuterEdgeLevels))
	, m_vertexDataSizeBytes					(NUM_TESS_LEVELS * m_numPatchesToDraw * m_vertexStride)
	, m_vertexBuffer						(m_context.getDeviceInterface(), m_context.getDevice(), m_context.getDefaultAllocator(),
											makeBufferCreateInfo(m_vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible)
	, m_resultBufferPrimitiveDataOffset		((int)sizeof(deInt32) * 4)
	, m_resultBufferSizeBytes				(m_resultBufferPrimitiveDataOffset + m_maxNumPrimitivesInDrawCall * sizeof(PerPrimitive))
	, m_resultBuffer						(m_context.getDeviceInterface(), m_context.getDevice(), m_context.getDefaultAllocator(),
											makeBufferCreateInfo(m_resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible)
	, m_descriptorSetLayout					(DescriptorSetLayoutBuilder()
											.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
											.build(m_context.getDeviceInterface(), m_context.getDevice()))
	, m_descriptorPool						(DescriptorPoolBuilder()
											.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
											.build(m_context.getDeviceInterface(), m_context.getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u))
	, m_descriptorSet						(makeDescriptorSet(m_context.getDeviceInterface(), m_context.getDevice(), *m_descriptorPool, *m_descriptorSetLayout))
	, m_renderPass							(makeRenderPassWithoutAttachments (m_context.getDeviceInterface(), m_context.getDevice()))
	, m_framebuffer							(makeFramebufferWithoutAttachments(m_context.getDeviceInterface(), m_context.getDevice(), *m_renderPass))
	, m_pipelineLayout						(makePipelineLayout               (m_context.getDeviceInterface(), m_context.getDevice(), *m_descriptorSetLayout))
	, m_cmdPool								(makeCommandPool                  (m_context.getDeviceInterface(), m_context.getDevice(), m_context.getUniversalQueueFamilyIndex()))
	, m_cmdBuffer							(allocateCommandBuffer            (m_context.getDeviceInterface(), m_context.getDevice(), *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY))
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const VkDescriptorBufferInfo resultBufferInfo = makeDescriptorBufferInfo(m_resultBuffer.get(), 0ull, m_resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(m_context.getDeviceInterface(), m_context.getDevice());
}